

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_source_begin_write_cloning.c
# Opt level: O2

int zip_source_begin_write_cloning(zip_source_t *src,zip_uint64_t offset)

{
  int ze;
  zip_int64_t zVar1;
  
  if (src->src == (zip_source_t *)0x0) {
    if (src->write_state != ZIP_SOURCE_WRITE_OPEN) {
      zVar1 = _zip_source_call(src,(void *)0x0,offset,ZIP_SOURCE_BEGIN_WRITE_CLONING);
      if (zVar1 < 0) {
        return -1;
      }
      src->write_state = ZIP_SOURCE_WRITE_OPEN;
      return 0;
    }
    ze = 0x12;
  }
  else {
    ze = 0x1c;
  }
  zip_error_set(&src->error,ze,0);
  return -1;
}

Assistant:

ZIP_EXTERN int
zip_source_begin_write_cloning(zip_source_t *src, zip_uint64_t offset) {
    if (ZIP_SOURCE_IS_LAYERED(src)) {
        zip_error_set(&src->error, ZIP_ER_OPNOTSUPP, 0);
        return -1;
    }

    if (ZIP_SOURCE_IS_OPEN_WRITING(src)) {
        zip_error_set(&src->error, ZIP_ER_INVAL, 0);
        return -1;
    }

    if (_zip_source_call(src, NULL, offset, ZIP_SOURCE_BEGIN_WRITE_CLONING) < 0) {
        return -1;
    }

    src->write_state = ZIP_SOURCE_WRITE_OPEN;

    return 0;
}